

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O2

If_Obj_t * Lpk_MapSuppRedDec_rec(Lpk_Man_t *p,uint *pTruth,int nVars,If_Obj_t **ppLeaves)

{
  Lpk_Man_t *p_00;
  If_Obj_t **ppLeaves_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  Kit_DsdNtk_t *pKVar6;
  Kit_DsdNtk_t *pKVar7;
  Kit_DsdNtk_t *pNtk;
  uint *puVar8;
  If_Obj_t *pIVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar;
  int iVarReused;
  uint *local_b0;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  Kit_DsdNtk_t *local_90;
  uint *local_88;
  uint local_7c;
  uint *local_78;
  uint *local_70;
  uint *local_68;
  Lpk_Man_t *local_60;
  uint *local_58;
  uint *local_50;
  uint *local_48;
  If_Obj_t **local_40;
  uint *local_38;
  
  pIVar9 = (If_Obj_t *)0x0;
  local_40 = ppLeaves;
  local_78 = (uint *)Vec_PtrEntry(p->vTtNodes,0);
  puVar4 = (uint *)Vec_PtrEntry(p->vTtNodes,1);
  local_98 = (uint *)Vec_PtrEntry(p->vTtNodes,2);
  local_38 = (uint *)Vec_PtrEntry(p->vTtNodes,3);
  local_70 = (uint *)Vec_PtrEntry(p->vTtNodes,4);
  local_a0 = (uint *)Vec_PtrEntry(p->vTtNodes,5);
  local_a8 = (uint *)Vec_PtrEntry(p->vTtNodes,6);
  local_48 = (uint *)Vec_PtrEntry(p->vTtNodes,7);
  local_b0 = (uint *)Vec_PtrEntry(p->vTtNodes,8);
  puVar5 = (uint *)Vec_PtrEntry(p->vTtNodes,9);
  local_58 = (uint *)Vec_PtrEntry(p->vTtNodes,10);
  local_50 = (uint *)Vec_PtrEntry(p->vTtNodes,0xb);
  uVar1 = Lpk_MapSuppRedDecSelect(p,pTruth,nVars,&iVar,&iVarReused);
  puVar8 = local_78;
  if (uVar1 != 0) {
    p->nCalledSRed = p->nCalledSRed + 1;
    local_68 = puVar5;
    Kit_TruthCofactor0New(local_78,pTruth,nVars,iVar);
    Kit_TruthCofactor1New(puVar4,pTruth,nVars,iVar);
    pKVar6 = Kit_DsdDecompose(puVar8,nVars);
    local_88 = puVar4;
    pKVar7 = Kit_DsdDecompose(puVar4,nVars);
    local_90 = Kit_DsdExpand(pKVar6);
    Kit_DsdNtkFree(pKVar6);
    pNtk = Kit_DsdExpand(pKVar7);
    Kit_DsdNtkFree(pKVar7);
    pKVar6 = local_90;
    puVar8 = local_98;
    Kit_DsdTruthPartial(p->pDsdMan,local_90,local_98,uVar1 & 0xffff);
    puVar4 = local_38;
    local_60 = p;
    Kit_DsdTruthPartial(p->pDsdMan,pNtk,local_38,(int)uVar1 >> 0x10);
    Kit_DsdNtkFree(pKVar6);
    Kit_DsdNtkFree(pNtk);
    Kit_TruthMuxVar(local_70,puVar8,puVar4,nVars,iVar);
    iVar2 = Kit_TruthFindFirstBit(puVar8,nVars);
    local_7c = Kit_TruthFindFirstBit(puVar4,nVars);
    local_90 = (Kit_DsdNtk_t *)CONCAT44(local_90._4_4_,iVar2);
    if ((iVar2 < 0) || ((int)local_7c < 0)) {
      __assert_fail("TrueMint0 >= 0 && TrueMint1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMux.c"
                    ,0xb9,
                    "If_Obj_t *Lpk_MapSuppRedDec_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)"
                   );
    }
    uVar3 = Kit_TruthFindFirstZero(puVar8,nVars);
    iVar2 = Kit_TruthFindFirstZero(puVar4,nVars);
    puVar8 = local_78;
    if (((int)uVar3 < 0) || (iVar2 < 0)) {
      __assert_fail("FalseMint0 >= 0 && FalseMint1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMux.c"
                    ,0xbd,
                    "If_Obj_t *Lpk_MapSuppRedDec_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)"
                   );
    }
    local_98 = (uint *)CONCAT44(local_98._4_4_,iVar2);
    Kit_TruthCopy(local_a0,local_78,nVars);
    Kit_TruthCopy(local_a8,puVar8,nVars);
    uVar12 = 0;
    puVar8 = local_88;
    uVar11 = 0;
    if (0 < nVars) {
      uVar11 = nVars;
    }
    for (; puVar4 = local_48, uVar11 != uVar12; uVar12 = uVar12 + 1) {
      uVar10 = 1 << ((byte)uVar12 & 0x1f);
      if (((uVar1 & 0xffff) >> (uVar12 & 0x1f) & 1) != 0) {
        if ((uVar10 & uVar3) == 0) {
          Kit_TruthCofactor0(local_a0,nVars,uVar12);
        }
        else {
          Kit_TruthCofactor1(local_a0,nVars,uVar12);
        }
        if (((uint)local_90 & uVar10) == 0) {
          Kit_TruthCofactor0(local_a8,nVars,uVar12);
          puVar8 = local_88;
        }
        else {
          Kit_TruthCofactor1(local_a8,nVars,uVar12);
          puVar8 = local_88;
        }
      }
    }
    Kit_TruthCopy(local_48,puVar8,nVars);
    Kit_TruthCopy(local_b0,puVar8,nVars);
    for (uVar3 = 0; puVar8 = local_68, uVar11 != uVar3; uVar3 = uVar3 + 1) {
      uVar12 = 1 << ((byte)uVar3 & 0x1f);
      if (((uint)((int)uVar1 >> 0x10) >> (uVar3 & 0x1f) & 1) != 0) {
        if (((uint)local_98 & uVar12) == 0) {
          Kit_TruthCofactor0(puVar4,nVars,uVar3);
        }
        else {
          Kit_TruthCofactor1(puVar4,nVars,uVar3);
        }
        if ((local_7c & uVar12) == 0) {
          Kit_TruthCofactor0(local_b0,nVars,uVar3);
        }
        else {
          Kit_TruthCofactor1(local_b0,nVars,uVar3);
        }
      }
    }
    Kit_TruthMuxVar(local_68,local_a0,local_a8,nVars,iVarReused);
    puVar5 = local_58;
    Kit_TruthMuxVar(local_58,puVar4,local_b0,nVars,iVarReused);
    puVar4 = local_50;
    Kit_TruthMuxVar(local_50,puVar8,puVar5,nVars,iVar);
    pKVar6 = Kit_DsdDecompose(local_70,nVars);
    pKVar7 = Kit_DsdDecompose(puVar4,nVars);
    ppLeaves_00 = local_40;
    p_00 = local_60;
    pIVar9 = Lpk_MapTree_rec(local_60,pKVar6,local_40,(uint)pKVar6->Root,(If_Obj_t *)0x0);
    ppLeaves_00[iVarReused] = pIVar9;
    pIVar9 = Lpk_MapTree_rec(p_00,pKVar7,ppLeaves_00,(uint)pKVar7->Root,(If_Obj_t *)0x0);
    Kit_DsdNtkFree(pKVar6);
    Kit_DsdNtkFree(pKVar7);
  }
  return pIVar9;
}

Assistant:

If_Obj_t * Lpk_MapSuppRedDec_rec( Lpk_Man_t * p, unsigned * pTruth, int nVars, If_Obj_t ** ppLeaves )
{
    Kit_DsdNtk_t * pNtkDec, * pNtkComp, * ppNtks[2], * pTemp;
    If_Obj_t * pObjNew;
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  1 );
    unsigned * pDec0 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  2 );
    unsigned * pDec1 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  3 );
    unsigned * pDec  = (unsigned *)Vec_PtrEntry( p->vTtNodes,  4 );
    unsigned * pCo00 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  5 );
    unsigned * pCo01 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  6 );
    unsigned * pCo10 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  7 );
    unsigned * pCo11 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  8 );
    unsigned * pCo0  = (unsigned *)Vec_PtrEntry( p->vTtNodes,  9 );
    unsigned * pCo1  = (unsigned *)Vec_PtrEntry( p->vTtNodes, 10 );
    unsigned * pCo   = (unsigned *)Vec_PtrEntry( p->vTtNodes, 11 );
    int TrueMint0, TrueMint1, FalseMint0, FalseMint1;
    int uSubsets, uSubset0, uSubset1, iVar, iVarReused, i;

    // determine if supp-red decomposition exists
    uSubsets = Lpk_MapSuppRedDecSelect( p, pTruth, nVars, &iVar, &iVarReused );
    if ( uSubsets == 0 )
        return NULL;
    p->nCalledSRed++;

    // get the cofactors
    Kit_TruthCofactor0New( pCof0, pTruth, nVars, iVar );
    Kit_TruthCofactor1New( pCof1, pTruth, nVars, iVar );

    // get the bound sets
    uSubset0 = uSubsets & 0xFFFF;
    uSubset1 = uSubsets >> 16;

    // compute the decomposed functions
    ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
    ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
    ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );      Kit_DsdNtkFree( pTemp );
    ppNtks[1] = Kit_DsdExpand( pTemp = ppNtks[1] );      Kit_DsdNtkFree( pTemp );
    Kit_DsdTruthPartial( p->pDsdMan, ppNtks[0], pDec0, uSubset0 );
    Kit_DsdTruthPartial( p->pDsdMan, ppNtks[1], pDec1, uSubset1 );
//    Kit_DsdTruthPartialTwo( p->pDsdMan, ppNtks[0], uSubset0, iVarReused, pCo0, pDec0 );
//    Kit_DsdTruthPartialTwo( p->pDsdMan, ppNtks[1], uSubset1, iVarReused, pCo1, pDec1 );
    Kit_DsdNtkFree( ppNtks[0] );
    Kit_DsdNtkFree( ppNtks[1] );
//Kit_DsdPrintFromTruth( pDec0, nVars );
//Kit_DsdPrintFromTruth( pDec1, nVars );
    // get the decomposed function
    Kit_TruthMuxVar( pDec, pDec0, pDec1, nVars, iVar );

    // find any true assignments of the decomposed functions
    TrueMint0 = Kit_TruthFindFirstBit( pDec0, nVars );
    TrueMint1 = Kit_TruthFindFirstBit( pDec1, nVars );
    assert( TrueMint0 >= 0 && TrueMint1 >= 0 );
    // find any false assignments of the decomposed functions
    FalseMint0 = Kit_TruthFindFirstZero( pDec0, nVars );
    FalseMint1 = Kit_TruthFindFirstZero( pDec1, nVars );
    assert( FalseMint0 >= 0 && FalseMint1 >= 0 );

    // cofactor the cofactors according to these minterms
    Kit_TruthCopy( pCo00, pCof0, nVars );
    Kit_TruthCopy( pCo01, pCof0, nVars );
    for ( i = 0; i < nVars; i++ )
        if ( uSubset0 & (1 << i) )
        {
            if ( FalseMint0 & (1 << i) )
                Kit_TruthCofactor1( pCo00, nVars, i );
            else
                Kit_TruthCofactor0( pCo00, nVars, i );
            if ( TrueMint0 & (1 << i) )
                Kit_TruthCofactor1( pCo01, nVars, i );
            else
                Kit_TruthCofactor0( pCo01, nVars, i );
        }
    Kit_TruthCopy( pCo10, pCof1, nVars );
    Kit_TruthCopy( pCo11, pCof1, nVars );
    for ( i = 0; i < nVars; i++ )
        if ( uSubset1 & (1 << i) )
        {
            if ( FalseMint1 & (1 << i) )
                Kit_TruthCofactor1( pCo10, nVars, i );
            else
                Kit_TruthCofactor0( pCo10, nVars, i );
            if ( TrueMint1 & (1 << i) )
                Kit_TruthCofactor1( pCo11, nVars, i );
            else
                Kit_TruthCofactor0( pCo11, nVars, i );
        }

    // derive the functions by composing them with the new variable (iVarReused)
    Kit_TruthMuxVar( pCo0, pCo00, pCo01, nVars, iVarReused );
    Kit_TruthMuxVar( pCo1, pCo10, pCo11, nVars, iVarReused );
//Kit_DsdPrintFromTruth( pCo0, nVars );
//Kit_DsdPrintFromTruth( pCo1, nVars );

    // derive the composition function
    Kit_TruthMuxVar( pCo , pCo0 , pCo1 , nVars, iVar );

    // process the decomposed function
    pNtkDec = Kit_DsdDecompose( pDec, nVars );
    pNtkComp = Kit_DsdDecompose( pCo, nVars );
//Kit_DsdPrint( stdout, pNtkDec );
//Kit_DsdPrint( stdout, pNtkComp );
//printf( "cofactored variable %c\n", 'a' + iVar );
//printf( "reused variable %c\n", 'a' + iVarReused );

    ppLeaves[iVarReused] = Lpk_MapTree_rec( p, pNtkDec, ppLeaves, pNtkDec->Root, NULL );
    pObjNew = Lpk_MapTree_rec( p, pNtkComp, ppLeaves, pNtkComp->Root, NULL );

    Kit_DsdNtkFree( pNtkDec );
    Kit_DsdNtkFree( pNtkComp );
    return pObjNew;
}